

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parameter_validation.h
# Opt level: O0

void Image_Function::
     OptimiseRoi<PenguinV_Image::ImageTemplate<unsigned_char>,PenguinV_Image::ImageTemplate<unsigned_char>>
               (uint32_t *width,uint32_t *height,ImageTemplate<unsigned_char> *image,
               ImageTemplate<unsigned_char> *args)

{
  bool bVar1;
  uint uVar2;
  ImageTemplate<unsigned_char> *in_RCX;
  uint *in_RSI;
  uint *in_RDI;
  ImageTemplate<unsigned_char> *in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  uint uVar3;
  uint32_t in_stack_ffffffffffffffa0;
  undefined1 local_49;
  
  PenguinV_Image::ImageTemplate<unsigned_char>::ImageTemplate
            ((ImageTemplate<unsigned_char> *)
             CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),in_stack_ffffffffffffff88
            );
  bVar1 = IsFullImageRow<PenguinV_Image::ImageTemplate<unsigned_char>,PenguinV_Image::ImageTemplate<unsigned_char>>
                    (in_stack_ffffffffffffffa0,in_RCX,
                     (ImageTemplate<unsigned_char> *)
                     CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
  local_49 = false;
  if (bVar1) {
    uVar3 = *in_RDI;
    uVar2 = std::numeric_limits<unsigned_int>::max();
    local_49 = uVar3 < uVar2 / *in_RSI;
  }
  PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate
            ((ImageTemplate<unsigned_char> *)0x1239d0);
  if ((local_49 & 1) != 0) {
    *in_RDI = *in_RDI * *in_RSI;
    *in_RSI = 1;
  }
  return;
}

Assistant:

void OptimiseRoi( uint32_t & width, uint32_t & height, const TImage & image, Args... args )
    {
        if( IsFullImageRow(width, image, args...) && ( width < (std::numeric_limits<uint32_t>::max() / height) ) ) {
            width = width * height;
            height = 1u;
        }
    }